

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O3

bool __thiscall QHstsHeaderParser::parseDirective(QHstsHeaderParser *this)

{
  QByteArray *lhs;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  char *local_70;
  QByteArray local_68;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = nextToken(this);
  if (!bVar2) {
LAB_00173ae0:
    bVar2 = false;
    goto LAB_00173ae2;
  }
  bVar2 = true;
  if ((this->token).d.size == 0) goto LAB_00173ae2;
  lhs = &this->token;
  local_48.d.d = (Data *)0x25883d;
  bVar3 = ::operator==(lhs,(char **)&local_48);
  if (bVar3) goto LAB_00173ae2;
  pcVar1 = (this->token).d.ptr;
  bVar2 = isTOKEN(*pcVar1);
  if (!bVar2) goto LAB_00173ae0;
  local_48.d.d = (this->token).d.d;
  local_48.d.size = (this->token).d.size;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.d.ptr = pcVar1;
  bVar2 = nextToken(this);
  if (bVar2) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char *)0x0;
    local_68.d.size = 0;
    local_70 = ";";
    bVar2 = ::operator==(lhs,&local_70);
    if (bVar2) {
      bVar2 = processDirective(this,&local_48,&local_68);
    }
    else {
      local_70 = "=";
      bVar2 = ::operator==(lhs,&local_70);
      if (bVar2) {
        bVar2 = nextToken(this);
        if ((bVar2) && ((this->token).d.size != 0)) {
          QByteArray::operator=(&local_68,lhs);
LAB_00173b50:
          bVar2 = processDirective(this,&local_48,&local_68);
          if (bVar2) {
            bVar2 = nextToken(this);
            goto LAB_00173b75;
          }
        }
      }
      else if ((this->token).d.size == 0) goto LAB_00173b50;
      bVar2 = false;
    }
LAB_00173b75:
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00173ae2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QHstsHeaderParser::parseDirective()
{
    // RFC 6797, 6.1:
    //
    // directive = directive-name [ "=" directive-value ]
    // directive-name = token
    // directive-value = token | quoted-string


    // RFC 2616, 2.2:
    //
    // token          = 1*<any CHAR except CTLs or separators>

    if (!nextToken())
        return false;

    if (!token.size()) // No more data, but no error.
        return true;

    if (token == ";") // That's a weird grammar, but that's what it is.
        return true;

    if (!isTOKEN(token.at(0))) // Not a valid directive-name.
        return false;

    const QByteArray directiveName = token;
    // 2. Try to read "=" or ";".
    if (!nextToken())
        return false;

    QByteArray directiveValue;
    if (token == ";") // No directive-value
        return processDirective(directiveName, directiveValue);

    if (token == "=") {
        // We expect a directive-value now:
        if (!nextToken() || !token.size())
            return false;
        directiveValue = token;
    } else if (token.size()) {
        // Invalid syntax:
        return false;
    }

    if (!processDirective(directiveName, directiveValue))
        return false;

    // Read either ";", or 'end of header', or some invalid token.
    return nextToken();
}